

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O0

int rapidjson::internal::CheckWithinHalfULP(double b,BigInteger *d,int dExp)

{
  int exp;
  int iVar1;
  int iVar2;
  uint64_t u;
  BigInteger *pBVar3;
  undefined1 local_3478 [8];
  BigInteger delta;
  BigInteger hS;
  BigInteger bS;
  BigInteger dS;
  uint local_50;
  int common_Exp2;
  int hS_Exp5;
  int hS_Exp2;
  int bS_Exp5;
  int bS_Exp2;
  int dS_Exp5;
  int dS_Exp2;
  int hExp;
  int bExp;
  uint64_t bInt;
  Double db;
  int dExp_local;
  BigInteger *d_local;
  double b_local;
  
  db.field_0.u_._4_4_ = dExp;
  Double::Double((Double *)&bInt,b);
  u = Double::IntegerSignificand((Double *)&bInt);
  iVar1 = Double::IntegerExponent((Double *)&bInt);
  iVar2 = iVar1 + -1;
  bS_Exp2 = 0;
  hS_Exp2 = 0;
  hS_Exp5 = 0;
  common_Exp2 = 0;
  local_50 = 0;
  if ((int)db.field_0.u_._4_4_ < 0) {
    hS_Exp2 = -db.field_0.u_._4_4_;
    hS_Exp5 = -db.field_0.u_._4_4_;
    common_Exp2 = -db.field_0.u_._4_4_;
    local_50 = -db.field_0.u_._4_4_;
  }
  else {
    bS_Exp2 = db.field_0.u_._4_4_;
  }
  exp = bS_Exp2;
  if (iVar1 < 0) {
    bS_Exp2 = bS_Exp2 - iVar1;
    common_Exp2 = common_Exp2 - iVar1;
  }
  else {
    hS_Exp2 = iVar1 + hS_Exp2;
  }
  if (iVar2 < 0) {
    bS_Exp2 = bS_Exp2 - iVar2;
    hS_Exp2 = hS_Exp2 - iVar2;
  }
  else {
    common_Exp2 = iVar2 + common_Exp2;
  }
  iVar1 = Min3<int>(bS_Exp2,hS_Exp2,common_Exp2);
  BigInteger::BigInteger((BigInteger *)&bS.count_,d);
  pBVar3 = BigInteger::MultiplyPow5((BigInteger *)&bS.count_,exp);
  BigInteger::operator<<=(pBVar3,(ulong)(uint)(bS_Exp2 - iVar1));
  BigInteger::BigInteger((BigInteger *)&hS.count_,u);
  pBVar3 = BigInteger::MultiplyPow5((BigInteger *)&hS.count_,hS_Exp5);
  BigInteger::operator<<=(pBVar3,(ulong)(uint)(hS_Exp2 - iVar1));
  BigInteger::BigInteger((BigInteger *)&delta.count_,1);
  pBVar3 = BigInteger::MultiplyPow5((BigInteger *)&delta.count_,local_50);
  BigInteger::operator<<=(pBVar3,(ulong)(uint)(common_Exp2 - iVar1));
  BigInteger::BigInteger((BigInteger *)local_3478,0);
  BigInteger::Difference((BigInteger *)&bS.count_,(BigInteger *)&hS.count_,(BigInteger *)local_3478)
  ;
  iVar1 = BigInteger::Compare((BigInteger *)local_3478,(BigInteger *)&delta.count_);
  return iVar1;
}

Assistant:

inline int CheckWithinHalfULP(double b, const BigInteger& d, int dExp) {
    const Double db(b);
    const uint64_t bInt = db.IntegerSignificand();
    const int bExp = db.IntegerExponent();
    const int hExp = bExp - 1;

    int dS_Exp2 = 0, dS_Exp5 = 0, bS_Exp2 = 0, bS_Exp5 = 0, hS_Exp2 = 0, hS_Exp5 = 0;

    // Adjust for decimal exponent
    if (dExp >= 0) {
        dS_Exp2 += dExp;
        dS_Exp5 += dExp;
    }
    else {
        bS_Exp2 -= dExp;
        bS_Exp5 -= dExp;
        hS_Exp2 -= dExp;
        hS_Exp5 -= dExp;
    }

    // Adjust for binary exponent
    if (bExp >= 0)
        bS_Exp2 += bExp;
    else {
        dS_Exp2 -= bExp;
        hS_Exp2 -= bExp;
    }

    // Adjust for half ulp exponent
    if (hExp >= 0)
        hS_Exp2 += hExp;
    else {
        dS_Exp2 -= hExp;
        bS_Exp2 -= hExp;
    }

    // Remove common power of two factor from all three scaled values
    int common_Exp2 = Min3(dS_Exp2, bS_Exp2, hS_Exp2);
    dS_Exp2 -= common_Exp2;
    bS_Exp2 -= common_Exp2;
    hS_Exp2 -= common_Exp2;

    BigInteger dS = d;
    dS.MultiplyPow5(static_cast<unsigned>(dS_Exp5)) <<= static_cast<unsigned>(dS_Exp2);

    BigInteger bS(bInt);
    bS.MultiplyPow5(static_cast<unsigned>(bS_Exp5)) <<= static_cast<unsigned>(bS_Exp2);

    BigInteger hS(1);
    hS.MultiplyPow5(static_cast<unsigned>(hS_Exp5)) <<= static_cast<unsigned>(hS_Exp2);

    BigInteger delta(0);
    dS.Difference(bS, &delta);

    return delta.Compare(hS);
}